

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

string * __thiscall
adios2::ToString_abi_cxx11_(string *__return_storage_ptr__,adios2 *this,MemorySpace value)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((int)this == 1) {
    pcVar2 = "MemorySpace::Host";
    paVar1 = &local_a;
  }
  else if ((int)this == 0) {
    pcVar2 = "MemorySpace::Detect";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "ToString: Unknown MemorySpace";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(MemorySpace value)
{
    switch (value)
    {
    case MemorySpace::Detect:
        return "MemorySpace::Detect";
    case MemorySpace::Host:
        return "MemorySpace::Host";
#ifdef ADIOS2_HAVE_GPU_SUPPORT
    case MemorySpace::GPU:
        return "MemorySpace::GPU";
#endif
    default:
        return "ToString: Unknown MemorySpace";
    }
}